

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  PlatformInterface *pPVar2;
  Handle<(vk::HandleType)18> object;
  char *pcVar3;
  bool bVar4;
  VkResult value;
  pointer pHVar5;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  MessageBuilder *this;
  Move<vk::Handle<(vk::HandleType)18>_> *ptr;
  Checked<vk::Handle<(vk::HandleType)18>_> CVar8;
  long lVar9;
  Parameters *extraout_RDX;
  char **value_00;
  ulong uVar10;
  ulong __n;
  Resources *this_00;
  Unique<vk::Handle<(vk::HandleType)14>_> *pUVar11;
  long lVar12;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  VkComputePipelineCreateInfo commonPipelineInfo;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfos;
  Environment objEnv;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_> local_270;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  Resources res;
  
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector(&handles,4,(allocator_type *)&res);
  lVar12 = 0;
  do {
    pUVar11 = &res.shaderModule.object;
    pHVar5 = handles.
             super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar12 == 5) {
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
LAB_004694aa:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Ok",(allocator<char> *)&commonPipelineInfo);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res);
LAB_004694d5:
      std::__cxx11::string::~string((string *)&res);
      return __return_storage_ptr__;
    }
    for (; pHVar5 < handles.
                    super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pHVar5 = pHVar5 + 1) {
      pHVar5->m_internal = 0xdededededededede;
    }
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&objAllocator,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&recorder,&objAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pPVar2 = context->m_platformInterface;
    pDVar6 = Context::getDeviceInterface(context);
    pVVar7 = Context::getDevice(context);
    objEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    objEnv.programBinaries = context->m_progCollection;
    objEnv.allocationCallbacks =
         &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    objEnv.maxResourceConsumers = 4;
    res.shaderModule.resources.binary = (ProgramBinary *)context->m_testCtx->m_log;
    objEnv.vkp = pPVar2;
    objEnv.vkd = pDVar6;
    objEnv.device = pVVar7;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar11);
    std::operator<<((ostream *)pUVar11,"Trying to create ");
    this = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&res,
                      &allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::ComputePipeline>
                       ::numObjects);
    poVar1 = &this->m_str;
    std::operator<<((ostream *)poVar1," objects with ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," allocation");
    pcVar3 = "%s<%s";
    if (lVar12 == 1) {
      pcVar3 = ",\n\t\t";
    }
    std::operator<<((ostream *)poVar1,pcVar3 + 4);
    std::operator<<((ostream *)poVar1," passing");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar11);
    ComputePipeline::Resources::Resources(&res,&objEnv,extraout_RDX);
    ::vk::DeterministicFailAllocator::reset(&objAllocator,MODE_COUNT_AND_FAIL,(deUint32)lVar12);
    pHVar5 = handles.
             super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    commonPipelineInfo.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    commonPipelineInfo.pNext = (void *)0x0;
    commonPipelineInfo.flags = 0;
    commonPipelineInfo.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    commonPipelineInfo.stage.pNext = (void *)0x0;
    commonPipelineInfo.stage.flags = 0;
    commonPipelineInfo.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
    commonPipelineInfo.stage.module.m_internal =
         res.shaderModule.object.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
         m_internal;
    commonPipelineInfo.stage.pName = "main";
    commonPipelineInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
    commonPipelineInfo.layout.m_internal =
         res.layout.object.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
    commonPipelineInfo.basePipelineHandle.m_internal = 0;
    commonPipelineInfo.basePipelineIndex = 0;
    uVar10 = (long)handles.
                   super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)handles.
                   super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    __n = uVar10 & 0xffffffff;
    std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
    vector(&pipelineInfos,__n,&commonPipelineInfo,(allocator_type *)&local_270);
    value = (*pDVar6->_vptr_DeviceInterface[0x31])
                      (pDVar6,pVVar7,
                       res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
                       m_data.object.m_internal,uVar10 & 0xffffffff,
                       pipelineInfos.
                       super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,pHVar5
                      );
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scopedHandles.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar10 = 0; __n != uVar10; uVar10 = uVar10 + 1) {
      object.m_internal = pHVar5[uVar10].m_internal;
      if (object.m_internal != 0) {
        ptr = (Move<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
        CVar8 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(object);
        (ptr->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
             (deUint64)CVar8.object.m_internal;
        (ptr->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface = pDVar6;
        (ptr->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device = pVVar7;
        (ptr->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
             &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
        de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::SharedPtr
                  (&local_270,ptr);
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
                    *)&scopedHandles,&local_270);
        de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::release(&local_270);
      }
    }
    std::
    _Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
    ::~_Vector_base(&pipelineInfos.
                     super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                   );
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&scopedHandles);
    ComputePipeline::Resources::~Resources(&res);
    lVar9 = lVar12;
    if (value == VK_SUCCESS) {
      res.shaderModule.resources.binary = (ProgramBinary *)context->m_testCtx->m_log;
      pUVar11 = &res.shaderModule.object;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar11);
      std::operator<<((ostream *)pUVar11,"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar11);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
      if (lVar12 != 0) goto LAB_004694aa;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Allocation callbacks not called",
                 (allocator<char> *)&commonPipelineInfo);
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&res);
      goto LAB_004694d5;
    }
    while (lVar9 != 4) {
      pHVar5 = handles.
               super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar9;
      lVar9 = lVar9 + 1;
      if (pHVar5->m_internal != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"Some object handles weren\'t set to NULL",
                   (allocator<char> *)&commonPipelineInfo);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
        goto LAB_004693d9;
      }
    }
    if (value != VK_ERROR_OUT_OF_HOST_MEMORY) {
      pipelineInfos.
      super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)::vk::getResultName(value);
      de::toString<char_const*>((string *)&commonPipelineInfo,(de *)&pipelineInfos,value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     "Got invalid error code: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &commonPipelineInfo);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
      std::__cxx11::string::~string((string *)&res);
      this_00 = (Resources *)&commonPipelineInfo;
LAB_004693e1:
      std::__cxx11::string::~string((string *)this_00);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
      return __return_storage_ptr__;
    }
    bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&recorder,0);
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Invalid allocation callback",(allocator<char> *)&commonPipelineInfo
                );
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
LAB_004693d9:
      this_00 = &res;
      goto LAB_004693e1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}